

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-entry.c
# Opt level: O0

void insert_embryo_category
               (embryonic_ui_entry *embryo,char *name,wchar_t psource_index,wchar_t priority,
               _Bool priority_set,wchar_t ind)

{
  wchar_t wVar1;
  char **__dest;
  char *pcVar2;
  void *pvVar3;
  undefined8 *puVar4;
  undefined8 *puVar5;
  int local_5c;
  wchar_t local_58;
  wchar_t local_54;
  wchar_t i_1;
  embryonic_category_reference *extended_2;
  category_reference *extended_1;
  wchar_t i;
  char **extended;
  wchar_t local_28;
  wchar_t cind;
  wchar_t ind_local;
  wchar_t wStack_1c;
  _Bool priority_set_local;
  wchar_t priority_local;
  wchar_t psource_index_local;
  char *name_local;
  embryonic_ui_entry *embryo_local;
  
  local_28 = ind;
  cind._3_1_ = priority_set;
  ind_local = priority;
  wStack_1c = psource_index;
  _priority_local = name;
  name_local = (char *)embryo;
  wVar1 = search_categories(name,(wchar_t *)((long)&extended + 4));
  if (wVar1 == L'\0') {
    if (n_category == nalloc_category) {
      if (L'\x3fffffff' < n_category) {
        quit("Too many categories");
      }
      if (nalloc_category == L'\0') {
        local_58 = L'\b';
      }
      else {
        local_58 = nalloc_category << 1;
      }
      nalloc_category = local_58;
      __dest = (char **)mem_alloc((long)local_58 << 3);
      if (L'\0' < extended._4_4_) {
        memcpy(__dest,categories,(long)extended._4_4_ << 3);
      }
      pcVar2 = string_make(_priority_local);
      __dest[extended._4_4_] = pcVar2;
      if (extended._4_4_ < n_category) {
        memcpy(__dest + (long)extended._4_4_ + 1,categories + extended._4_4_,
               (long)(n_category - extended._4_4_) << 3);
      }
      mem_free(categories);
      categories = __dest;
    }
    else {
      for (extended_1._4_4_ = n_category; extended._4_4_ < extended_1._4_4_;
          extended_1._4_4_ = extended_1._4_4_ + L'\xffffffff') {
        categories[extended_1._4_4_] = categories[extended_1._4_4_ + L'\xffffffff'];
      }
      pcVar2 = string_make(_priority_local);
      categories[extended._4_4_] = pcVar2;
    }
    n_category = n_category + L'\x01';
  }
  if (*(int *)(*(long *)name_local + 0x1bc) == *(int *)(*(long *)name_local + 0x1c0)) {
    if (0x3fffffff < *(int *)(*(long *)name_local + 0x1c0)) {
      quit("Too many categories for an ui_entry");
    }
    if (*(int *)(*(long *)name_local + 0x1c0) == 0) {
      local_5c = 4;
    }
    else {
      local_5c = *(int *)(*(long *)name_local + 0x1c0) << 1;
    }
    *(int *)(*(long *)name_local + 0x1c0) = local_5c;
    if ((name_local[0x1c] & 1U) == 0) {
      pvVar3 = mem_alloc((long)*(int *)(*(long *)name_local + 0x1c0) * 0x18);
      if (L'\0' < local_28) {
        memcpy(pvVar3,*(void **)(name_local + 8),(long)local_28 * 0x18);
      }
      *(char **)((long)pvVar3 + (long)local_28 * 0x18) = categories[extended._4_4_];
      *(wchar_t *)((long)pvVar3 + (long)local_28 * 0x18 + 8) = wStack_1c;
      *(wchar_t *)((long)pvVar3 + (long)local_28 * 0x18 + 0xc) = ind_local;
      *(byte *)((long)pvVar3 + (long)local_28 * 0x18 + 0x10) = cind._3_1_ & 1;
      if (local_28 < *(wchar_t *)(*(long *)name_local + 0x1bc)) {
        memcpy((void *)((long)pvVar3 + (long)local_28 * 0x18 + 0x18),
               (void *)(*(long *)(name_local + 8) + (long)local_28 * 0x18),
               (long)(*(int *)(*(long *)name_local + 0x1bc) - local_28) * 0x18);
      }
      mem_free(*(void **)(name_local + 8));
      *(void **)(name_local + 8) = pvVar3;
    }
    else {
      pvVar3 = mem_alloc((long)*(int *)(*(long *)name_local + 0x1c0) << 4);
      if (L'\0' < local_28) {
        memcpy(pvVar3,*(void **)(*(long *)name_local + 8),(long)local_28 << 4);
      }
      *(char **)((long)pvVar3 + (long)local_28 * 0x10) = categories[extended._4_4_];
      *(wchar_t *)((long)pvVar3 + (long)local_28 * 0x10 + 8) = ind_local;
      *(byte *)((long)pvVar3 + (long)local_28 * 0x10 + 0xc) = cind._3_1_ & 1;
      if (local_28 < *(wchar_t *)(*(long *)name_local + 0x1bc)) {
        memcpy((void *)((long)pvVar3 + (long)local_28 * 0x10 + 0x10),
               (void *)(*(long *)(*(long *)name_local + 8) + (long)local_28 * 0x10),
               (long)(*(int *)(*(long *)name_local + 0x1bc) - local_28) << 4);
      }
      mem_free(*(void **)(*(long *)name_local + 8));
      *(void **)(*(long *)name_local + 8) = pvVar3;
    }
  }
  else if ((name_local[0x1c] & 1U) == 0) {
    for (local_54 = *(wchar_t *)(*(long *)name_local + 0x1bc); local_28 < local_54;
        local_54 = local_54 + L'\xffffffff') {
      puVar4 = (undefined8 *)(*(long *)(name_local + 8) + (long)local_54 * 0x18);
      puVar5 = (undefined8 *)(*(long *)(name_local + 8) + (long)(local_54 + L'\xffffffff') * 0x18);
      *puVar4 = *puVar5;
      puVar4[1] = puVar5[1];
      puVar4[2] = puVar5[2];
    }
    *(char **)(*(long *)(name_local + 8) + (long)local_28 * 0x18) = categories[extended._4_4_];
    *(wchar_t *)(*(long *)(name_local + 8) + (long)local_28 * 0x18 + 8) = wStack_1c;
    *(wchar_t *)(*(long *)(name_local + 8) + (long)local_28 * 0x18 + 0xc) = ind_local;
    *(byte *)(*(long *)(name_local + 8) + (long)local_28 * 0x18 + 0x10) = cind._3_1_ & 1;
  }
  else {
    for (local_54 = *(wchar_t *)(*(long *)name_local + 0x1bc); local_28 < local_54;
        local_54 = local_54 + L'\xffffffff') {
      puVar4 = (undefined8 *)(*(long *)(*(long *)name_local + 8) + (long)local_54 * 0x10);
      puVar5 = (undefined8 *)
               (*(long *)(*(long *)name_local + 8) + (long)(local_54 + L'\xffffffff') * 0x10);
      *puVar4 = *puVar5;
      puVar4[1] = puVar5[1];
    }
    *(char **)(*(long *)(*(long *)name_local + 8) + (long)local_28 * 0x10) =
         categories[extended._4_4_];
    *(wchar_t *)(*(long *)(*(long *)name_local + 8) + (long)local_28 * 0x10 + 8) = ind_local;
    *(byte *)(*(long *)(*(long *)name_local + 8) + (long)local_28 * 0x10 + 0xc) = cind._3_1_ & 1;
  }
  *(int *)(*(long *)name_local + 0x1bc) = *(int *)(*(long *)name_local + 0x1bc) + 1;
  return;
}

Assistant:

static void insert_embryo_category(struct embryonic_ui_entry *embryo,
	const char *name, int psource_index, int priority, bool priority_set,
	int ind)
{
	int cind;

	if (! search_categories(name, &cind)) {
		if (n_category == nalloc_category) {
			char **extended;

			if (n_category > INT_MAX / 2) {
				quit("Too many categories");
			}
			nalloc_category = (nalloc_category == 0) ?
				8 : nalloc_category * 2;
			extended = mem_alloc(nalloc_category *
				sizeof(*extended));
			if (cind > 0) {
				memcpy(extended, categories,
					cind * sizeof(*extended));
			}
			extended[cind] = string_make(name);
			if (cind < n_category) {
				memcpy(extended + cind + 1, categories + cind,
					(n_category - cind) *
					sizeof(*extended));
			}
			mem_free(categories);
			categories = extended;
		} else {
			int i;

			for (i = n_category; i > cind; --i) {
				categories[i] = categories[i - 1];
			}
			categories[cind] = string_make(name);
		}
		++n_category;
	}
	if (embryo->entry->n_category == embryo->entry->nalloc_category) {
		if (embryo->entry->nalloc_category > INT_MAX / 2) {
			quit("Too many categories for an ui_entry");
		}
		embryo->entry->nalloc_category =
			(embryo->entry->nalloc_category == 0) ?
			4 : 2 * embryo->entry->nalloc_category;
		if (embryo->exists) {
			struct category_reference *extended =
				mem_alloc(embryo->entry->nalloc_category *
				sizeof(*extended));

			if (ind > 0) {
				(void) memcpy(extended,
					embryo->entry->categories,
					ind * sizeof(*extended));
			}
			extended[ind].name = categories[cind];
			extended[ind].priority = priority;
			extended[ind].priority_set = priority_set;
			if (ind < embryo->entry->n_category) {
				(void) memcpy(extended + ind + 1,
					embryo->entry->categories + ind,
					(embryo->entry->n_category - ind) *
					sizeof(*extended));
			}
			mem_free(embryo->entry->categories);
			embryo->entry->categories = extended;
		} else {
			struct embryonic_category_reference *extended =
				mem_alloc(embryo->entry->nalloc_category *
				sizeof(*extended));

			if (ind > 0) {
				(void) memcpy(extended,
					embryo->categories,
					ind * sizeof(*extended));
			}
			extended[ind].name = categories[cind];
			extended[ind].psource_index = psource_index;
			extended[ind].priority = priority;
			extended[ind].priority_set = priority_set;
			if (ind < embryo->entry->n_category) {
				(void) memcpy(extended + ind + 1,
					embryo->categories + ind,
					(embryo->entry->n_category - ind) *
					sizeof(*extended));
			}
			mem_free(embryo->categories);
			embryo->categories = extended;
		}
	} else {
		int i;

		if (embryo->exists) {
			for (i = embryo->entry->n_category; i > ind; --i) {
				embryo->entry->categories[i] =
					embryo->entry->categories[i - 1];
			}
			embryo->entry->categories[ind].name = categories[cind];
			embryo->entry->categories[ind].priority = priority;
			embryo->entry->categories[ind].priority_set =
				priority_set;
		} else {
			for (i = embryo->entry->n_category; i > ind; --i) {
				embryo->categories[i] =
					embryo->categories[i - 1];
			}
			embryo->categories[ind].name = categories[cind];
			embryo->categories[ind].psource_index = psource_index;
			embryo->categories[ind].priority = priority;
			embryo->categories[ind].priority_set = priority_set;
		}
	}
	++embryo->entry->n_category;
}